

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O2

int If_CutPerformCheck75(If_Man_t *p,uint *pTruth0,int nVars,int nLeaves,char *pStr)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  undefined1 *puVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 *puVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 *puVar16;
  undefined1 local_448 [8];
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  ulong local_428;
  ulong local_420;
  char pDsdStr [1000];
  
  local_448 = (undefined1  [8])*(word *)pTruth0;
  uStack_440 = *(undefined8 *)(pTruth0 + 2);
  local_438 = *(undefined8 *)(pTruth0 + 4);
  uStack_430 = *(undefined8 *)(pTruth0 + 6);
  if (8 < nLeaves) {
    __assert_fail("nLeaves <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                  ,0x133,"int If_CutPerformCheck75(If_Man_t *, unsigned int *, int, int, char *)");
  }
  uVar6 = nLeaves;
  if (p->pPars->fCutMin == 0) {
    uVar10 = 0;
    uVar15 = 0;
    if (0 < nLeaves) {
      uVar15 = nLeaves;
    }
    uVar6 = 0;
    uVar4 = 0;
    for (; uVar15 != uVar10; uVar10 = uVar10 + 1) {
      iVar5 = Abc_TtHasVar((word *)local_448,nLeaves,uVar10);
      uVar9 = 1 << ((byte)uVar10 & 0x1f);
      uVar6 = uVar6 + iVar5;
      if (iVar5 == 0) {
        uVar9 = 0;
      }
      uVar4 = uVar4 | uVar9;
    }
    if (uVar4 != 0) {
      if ((int)uVar4 < 1) {
        __assert_fail("Supp > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x575,"int Abc_TtSuppIsMinBase(int)");
      }
      if ((uVar4 + 1 & uVar4) != 0) {
        uVar10 = 1 << ((char)nLeaves - 6U & 0x1f);
        if (nLeaves < 7) {
          uVar10 = 1;
        }
        uVar14 = 0;
        uVar11 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar11 = uVar14;
        }
        local_428 = (ulong)uVar15;
        uVar15 = 0;
        for (; uVar14 != local_428; uVar14 = uVar14 + 1) {
          if ((uVar4 >> ((uint)uVar14 & 0x1f) & 1) != 0) {
            local_420 = uVar14;
            while ((long)(int)uVar15 < (long)uVar14) {
              uVar1 = uVar14 - 1;
              if ((long)uVar14 < 6) {
                for (uVar12 = 0; uVar14 = uVar1, uVar11 != uVar12; uVar12 = uVar12 + 1) {
                  uVar14 = *(ulong *)(local_448 + uVar12 * 8);
                  bVar7 = (byte)(1 << ((byte)uVar1 & 0x1f));
                  *(ulong *)(local_448 + uVar12 * 8) =
                       (uVar14 & s_PMasks[uVar1][2]) >> (bVar7 & 0x3f) |
                       (s_PMasks[uVar1][1] & uVar14) << (bVar7 & 0x3f) | s_PMasks[uVar1][0] & uVar14
                  ;
                }
              }
              else if (uVar1 == 5) {
                for (puVar8 = local_448; uVar14 = uVar1, puVar8 < local_448 + (long)(int)uVar10 * 8;
                    puVar8 = puVar8 + 0x10) {
                  *(ulong *)(puVar8 + 4) =
                       CONCAT44((int)*(undefined8 *)(puVar8 + 4),
                                (int)((ulong)*(undefined8 *)(puVar8 + 4) >> 0x20));
                }
              }
              else {
                uVar9 = 1 << ((char)uVar14 - 7U & 0x1f);
                if (uVar14 < 8) {
                  uVar9 = 1;
                }
                uVar12 = 0;
                if (0 < (int)uVar9) {
                  uVar12 = (ulong)uVar9;
                }
                puVar16 = local_448 + (long)(int)(uVar9 * 2) * 8;
                lVar2 = (long)(int)(uVar9 * 4) * 8;
                puVar13 = local_448 + (long)(int)uVar9 * 8;
                for (puVar8 = local_448; uVar14 = uVar1, puVar8 < local_448 + (long)(int)uVar10 * 8;
                    puVar8 = puVar8 + (long)(int)(uVar9 * 4) * 8) {
                  for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
                    uVar3 = *(undefined8 *)(puVar13 + uVar14 * 8);
                    *(undefined8 *)(puVar13 + uVar14 * 8) = *(undefined8 *)(puVar16 + uVar14 * 8);
                    *(undefined8 *)(puVar16 + uVar14 * 8) = uVar3;
                  }
                  puVar16 = puVar16 + lVar2;
                  puVar13 = puVar13 + lVar2;
                }
              }
            }
            uVar15 = uVar15 + 1;
            uVar14 = local_420;
          }
        }
        if (uVar15 != uVar6) {
          __assert_fail("Var == nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x6e7,"void Abc_TtShrink(word *, int, int, unsigned int)");
        }
      }
    }
  }
  uVar15 = 1;
  if ((5 < (int)uVar6) &&
     ((7 < uVar6 || (iVar5 = If_CutPerformCheck16(p,(uint *)local_448,nVars,uVar6,"44"), iVar5 == 0)
      ))) {
    if ((p->pPars->fDeriveLuts == 0) && ((uVar6 == 8 && (p->pPars->fEnableCheck75 != 0)))) {
      uVar15 = 0;
      iVar5 = Dau_DsdDecompose((word *)local_448,8,0,0,pDsdStr);
      if (iVar5 < 5) {
        uVar6 = Dau_DsdCheckDecAndExist(pDsdStr);
        uVar15 = uVar6 >> 4 & 1;
      }
    }
    else {
      iVar5 = If_CutPerformCheck45(p,(uint *)local_448,nVars,uVar6,pStr);
      if (iVar5 == 0) {
        iVar5 = If_CutPerformCheck54(p,(uint *)local_448,nVars,uVar6,pStr);
        uVar15 = (uint)(iVar5 != 0);
      }
    }
  }
  return uVar15;
}

Assistant:

int If_CutPerformCheck75( If_Man_t * p, unsigned * pTruth0, int nVars, int nLeaves, char * pStr )
{
    word * pTruthW = (word *)pTruth0;
    word pTruth[4] = { pTruthW[0], pTruthW[1], pTruthW[2], pTruthW[3] };
    assert( nLeaves <= 8 );
    if ( !p->pPars->fCutMin )
        Abc_TtMinimumBase( pTruth, NULL, nLeaves, &nLeaves );
    if ( nLeaves < 6 )
        return 1;
//    if ( nLeaves < 8 && If_CutPerformCheck07( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
    if ( nLeaves < 8 && If_CutPerformCheck16( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
        return 1;
    // this is faster but not compatible with -z
    if ( !p->pPars->fDeriveLuts && p->pPars->fEnableCheck75 && nLeaves == 8 )
    {
//        char pDsdStr[1000] = "(!(abd)!(c!([fe][gh])))";
        char pDsdStr[1000];
        int nSizeNonDec = Dau_DsdDecompose( (word *)pTruth, nLeaves, 0, 0, pDsdStr );
        if ( nSizeNonDec >= 5 )
            return 0;
        if ( Dau_DsdCheckDecAndExist(pDsdStr) & 0x10 ) // bit 4
            return 1;
        return 0;
    }
    if ( If_CutPerformCheck45( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
        return 1;
    if ( If_CutPerformCheck54( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
        return 1;
    return 0;
}